

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniFB_timer.c
# Opt level: O0

double mfb_timer_now(mfb_timer *tmr)

{
  uint64_t uVar1;
  uint64_t *in_RDI;
  undefined1 auVar2 [16];
  uint64_t counter;
  double local_8;
  
  if (in_RDI == (uint64_t *)0x0) {
    local_8 = 0.0;
  }
  else {
    uVar1 = mfb_timer_tick();
    in_RDI[2] = in_RDI[2] + (uVar1 - *in_RDI);
    *in_RDI = uVar1;
    uVar1 = in_RDI[2];
    auVar2._8_4_ = (int)(uVar1 >> 0x20);
    auVar2._0_8_ = uVar1;
    auVar2._12_4_ = 0x45300000;
    local_8 = ((auVar2._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) * g_timer_resolution;
  }
  return local_8;
}

Assistant:

double
mfb_timer_now(struct mfb_timer *tmr) {
    uint64_t    counter;

    if(tmr == 0x0) 
        return 0.0;

    counter         = mfb_timer_tick();
    tmr->time      += (counter - tmr->start_time);
    tmr->start_time = counter;

    return tmr->time * g_timer_resolution;
}